

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

IdentifierLookupResult *
anon_unknown.dwarf_8df1c::LookupObjectByName(ExpressionContext *ctx,uint nameHash)

{
  bool bVar1;
  bool_type bVar2;
  Node *local_48;
  long *local_40;
  VariableData *variable;
  Node lookup;
  ScopeData *scope;
  uint nameHash_local;
  ExpressionContext *ctx_local;
  
  lookup.node = (Node *)ctx->scope;
  do {
    if (lookup.node == (Node *)0x0) {
      return (IdentifierLookupResult *)0x0;
    }
    _variable = DirectChainedMap<IdentifierLookupResult>::first
                          ((DirectChainedMap<IdentifierLookupResult> *)(lookup.node + 0x120),
                           nameHash);
    bVar2 = DirectChainedMap::NodeIterator::operator_cast_to_function_pointer
                      ((NodeIterator *)&variable);
    if (bVar2 != 0) {
      if ((ctx->lookupLocation != (SynBase *)0x0) && (((byte)lookup.node[0x150] & 1) == 0)) {
        local_40 = *(long **)(lookup.start + 8);
        while( true ) {
          bVar1 = false;
          if ((local_40 != (long *)0x0) && (bVar1 = false, local_40[1] == 0)) {
            bVar1 = (ctx->lookupLocation->pos).begin < *(char **)(*local_40 + 0x20);
          }
          if (!bVar1) break;
          _variable = DirectChainedMap<IdentifierLookupResult>::next
                                ((DirectChainedMap<IdentifierLookupResult> *)(lookup.node + 0x120),
                                 _variable);
          local_48 = variable._8_8_;
          if (local_48 == (Node *)0x0) {
            local_40 = (long *)0x0;
          }
          else {
            local_40 = *(long **)(local_48 + 8);
          }
        }
      }
      if (lookup.start != (Node *)0x0) {
        return (IdentifierLookupResult *)(lookup.start + 8);
      }
    }
    lookup.node = *(Node **)lookup.node;
  } while( true );
}

Assistant:

IdentifierLookupResult* LookupObjectByName(ExpressionContext &ctx, unsigned nameHash)
	{
		typedef DirectChainedMap<IdentifierLookupResult>::NodeIterator Node;

		ScopeData *scope = ctx.scope;

		while(scope)
		{
			if(Node lookup = scope->idLookupMap.first(nameHash))
			{
				if(ctx.lookupLocation && !scope->unrestricted)
				{
					VariableData *variable = lookup.node->value.variable;

					// Skip variables that are not visible from current point
					while(variable && !variable->importModule && variable->source->pos.begin > ctx.lookupLocation->pos.begin)
					{
						lookup = scope->idLookupMap.next(lookup);

						if(lookup.node)
							variable = lookup.node->value.variable;
						else
							variable = NULL;
					}
				}

				if(lookup.node)
					return &lookup.node->value;;
			}

			scope = scope->scope;
		}

		return NULL;
	}